

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O0

void RigidBodyDynamics::ForwardDynamicsLagrangian
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,VectorNd *QDDot,
               LinearSolver linear_solver,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext,MatrixNd *H,
               VectorNd *C)

{
  undefined4 in_R9D;
  bool bVar1;
  bool bVar2;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_00000010;
  double *in_stack_00000018;
  vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *in_stack_000001b8;
  VectorNd *in_stack_000001c0;
  VectorNd *in_stack_000001c8;
  VectorNd *in_stack_000001d0;
  VectorNd *in_stack_000001d8;
  Model *in_stack_000001e0;
  undefined1 in_stack_0000029f;
  MatrixNd *in_stack_000002a0;
  VectorNd *in_stack_000002a8;
  Model *in_stack_000002b0;
  bool free_C;
  bool free_H;
  DenseBase<Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *in_stack_fffffffffffffbd8;
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffbe0;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  *in_stack_fffffffffffffbe8;
  SolverBase<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_fffffffffffffbf0;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffc00;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *in_stack_fffffffffffffc08;
  double *in_stack_fffffffffffffc30;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffc38;
  
  bVar1 = in_stack_00000010 == (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0;
  if (bVar1) {
    in_stack_00000010 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)operator_new(0x18);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
              ((Index)in_stack_fffffffffffffbe8,(Index)in_stack_fffffffffffffbe0);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffbf0,
               in_stack_fffffffffffffbe8);
    in_stack_fffffffffffffc38 = in_stack_00000010;
  }
  bVar2 = in_stack_00000018 == (double *)0x0;
  if (bVar2) {
    in_stack_00000018 = (double *)operator_new(0x10);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
              ((Index)in_stack_fffffffffffffbe8);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffbf0,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)in_stack_fffffffffffffbe8);
    in_stack_fffffffffffffc30 = in_stack_00000018;
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffbe0);
  InverseDynamics(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,
                  in_stack_000001c0,in_stack_000001b8);
  CompositeRigidBodyAlgorithm
            (in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,(bool)in_stack_0000029f);
  switch(in_R9D) {
  case 1:
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::partialPivLu
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffbe8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
              (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
    ::operator+(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    Eigen::SolverBase<Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
    solve<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              (in_stack_fffffffffffffbf0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)in_stack_fffffffffffffbe8);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffbe0,
               in_stack_fffffffffffffbd8);
    Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~PartialPivLU
              ((PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffbe0)
    ;
    break;
  case 2:
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::colPivHouseholderQr
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffbe8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
              (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
    ::operator+(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
    solve<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *
               )in_stack_fffffffffffffbf0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)in_stack_fffffffffffffbe8);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffbe0,
               (DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)in_stack_fffffffffffffbd8);
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~ColPivHouseholderQR
              (in_stack_fffffffffffffbe0);
    break;
  case 3:
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::householderQr
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffbe8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
              (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
    ::operator+(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    Eigen::SolverBase<Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
    solve<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((SolverBase<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               in_stack_fffffffffffffbf0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)in_stack_fffffffffffffbe8);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffbe0,
               (DenseBase<Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)in_stack_fffffffffffffbd8);
    Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR
              ((HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffbe0
              );
    break;
  case 4:
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::llt
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffbe8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
              (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
    ::operator+(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    Eigen::SolverBase<Eigen::LLT<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>>::
    solve<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((SolverBase<Eigen::LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>_> *)
               in_stack_fffffffffffffbf0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)in_stack_fffffffffffffbe8);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffbe0,
               (DenseBase<Eigen::Solve<Eigen::LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)in_stack_fffffffffffffbd8);
    Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::~LLT
              ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)in_stack_fffffffffffffbe0);
  }
  if ((bVar2) && (in_stack_00000018 != (double *)0x0)) {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x21e9fa);
    operator_delete(in_stack_00000018,0x10);
  }
  if ((bVar1) && (in_stack_00000010 != (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0))
  {
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x21ea30)
    ;
    operator_delete(in_stack_00000010,0x18);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsLagrangian (
		Model &model,
		const VectorNd &Q,
		const VectorNd &QDot,
		const VectorNd &Tau,
		VectorNd &QDDot,
		Math::LinearSolver linear_solver,
		std::vector<SpatialVector> *f_ext,
		Math::MatrixNd *H,
		Math::VectorNd *C
		) {
	LOG << "-------- " << __func__ << " --------" << std::endl;

	bool free_H = false;
	bool free_C = false;

	if (H == NULL) {
		H = new MatrixNd (MatrixNd::Zero(model.dof_count, model.dof_count));
		free_H = true;
	}

	if (C == NULL) {
		C = new VectorNd (VectorNd::Zero(model.dof_count));
		free_C = true;
	}

	// we set QDDot to zero to compute C properly with the InverseDynamics
	// method.
	QDDot.setZero();

	InverseDynamics (model, Q, QDot, QDDot, (*C), f_ext);
	CompositeRigidBodyAlgorithm (model, Q, *H, false);

	LOG << "A = " << std::endl << *H << std::endl;
	LOG << "b = " << std::endl << *C * -1. + Tau << std::endl;

#ifndef RBDL_USE_SIMPLE_MATH
	switch (linear_solver) {
		case (LinearSolverPartialPivLU) :
			QDDot = H->partialPivLu().solve (*C * -1. + Tau);
			break;
		case (LinearSolverColPivHouseholderQR) :
			QDDot = H->colPivHouseholderQr().solve (*C * -1. + Tau);
			break;
		case (LinearSolverHouseholderQR) :
			QDDot = H->householderQr().solve (*C * -1. + Tau);
			break;
		case (LinearSolverLLT) :
			QDDot = H->llt().solve (*C * -1. + Tau);
			break;
		default:
			LOG << "Error: Invalid linear solver: " << linear_solver << std::endl;
			assert (0);
			break;
	}
#else
	bool solve_successful = LinSolveGaussElimPivot (*H, *C * -1. + Tau, QDDot);
	assert (solve_successful);
#endif

	if (free_C) {
		delete C;
	}

	if (free_H) {
		delete H;
	}


	LOG << "x = " << QDDot << std::endl;
}